

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O0

size_t __thiscall GYMPlayer::DeviceID2OptionID(GYMPlayer *this,UINT32 id)

{
  size_type sVar1;
  const_reference pvVar2;
  char local_1e;
  UINT8 local_1d;
  UINT8 instance;
  UINT8 type;
  UINT32 id_local;
  GYMPlayer *this_local;
  
  if ((id & 0x80000000) == 0) {
    sVar1 = std::vector<GYMPlayer::DevCfg,_std::allocator<GYMPlayer::DevCfg>_>::size
                      (&this->_devCfgs);
    if (sVar1 <= id) {
      return 0xffffffffffffffff;
    }
    pvVar2 = std::vector<GYMPlayer::DevCfg,_std::allocator<GYMPlayer::DevCfg>_>::operator[]
                       (&this->_devCfgs,(ulong)id);
    local_1d = pvVar2->type;
    local_1e = '\0';
  }
  else {
    local_1d = (UINT8)id;
    local_1e = (char)(id >> 0x10);
  }
  if (local_1e == '\0') {
    if (local_1d == '\x02') {
      return 0;
    }
    if (local_1d == '\0') {
      return 1;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t GYMPlayer::DeviceID2OptionID(UINT32 id) const
{
	UINT8 type;
	UINT8 instance;
	
	if (id & 0x80000000)
	{
		type = (id >> 0) & 0xFF;
		instance = (id >> 16) & 0xFF;
	}
	else if (id < _devCfgs.size())
	{
		type = _devCfgs[id].type;
		instance = 0;
	}
	else
	{
		return (size_t)-1;
	}
	
	if (instance == 0)
	{
		if (type == DEVID_YM2612)
			return 0;
		else if (type == DEVID_SN76496)
			return 1;
	}
	return (size_t)-1;
}